

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O0

void __thiscall QActionPrivate::redoGrab(QActionPrivate *this,QShortcutMap *map)

{
  bool bVar1;
  QObject *pQVar2;
  QKeySequence *this_00;
  const_iterator o;
  int *piVar3;
  QObject *in_RSI;
  QActionPrivate *in_RDI;
  long in_FS_OFFSET;
  int id_2;
  add_const_t<QList<int>_> *__range2_1;
  int id_1;
  add_const_t<QList<int>_> *__range2;
  QKeySequence *shortcut;
  add_const_t<QList<QKeySequence>_> *__range1_1;
  int id;
  add_const_t<QList<int>_> *__range1;
  QAction *q;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  const_iterator __end2;
  const_iterator __begin2;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  const_iterator __end1;
  const_iterator __begin1;
  parameter_type in_stack_fffffffffffffeac;
  QList<QKeySequence> *in_stack_fffffffffffffeb0;
  QObject *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  int iVar4;
  QObject *in_stack_fffffffffffffed8;
  QObject *in_stack_fffffffffffffee0;
  QObject *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef8;
  ShortcutContext SVar5;
  QList<int> *this_01;
  QObject *owner;
  const_iterator local_68 [2];
  int *local_58;
  const_iterator local_50;
  const_iterator local_48;
  QKeySequence *local_40;
  const_iterator local_38;
  const_iterator local_30 [2];
  int *local_20;
  const_iterator local_18;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = &q_func(in_RDI)->super_QObject;
  local_10.i = (int *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<int>::begin((QList<int> *)in_stack_fffffffffffffeb0);
  local_18.i = (int *)&DAT_aaaaaaaaaaaaaaaa;
  local_18 = QList<int>::end((QList<int> *)in_stack_fffffffffffffeb0);
  while( true ) {
    local_20 = local_18.i;
    bVar1 = QList<int>::const_iterator::operator!=(&local_10,local_18);
    if (!bVar1) break;
    piVar3 = QList<int>::const_iterator::operator*(&local_10);
    iVar4 = *piVar3;
    if (iVar4 != 0) {
      owner = in_RSI;
      QKeySequence::QKeySequence((QKeySequence *)0x974c16);
      QShortcutMap::removeShortcut
                ((QShortcutMap *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),iVar4
                 ,owner,(QKeySequence *)in_stack_fffffffffffffec8);
      QKeySequence::~QKeySequence((QKeySequence *)in_stack_fffffffffffffeb0);
    }
    QList<int>::const_iterator::operator++(&local_10);
  }
  QList<int>::clear((QList<int> *)in_stack_fffffffffffffeb0);
  local_30[0].i = (QKeySequence *)&DAT_aaaaaaaaaaaaaaaa;
  local_30[0] = QList<QKeySequence>::begin(in_stack_fffffffffffffeb0);
  local_38.i = (QKeySequence *)&DAT_aaaaaaaaaaaaaaaa;
  local_38 = QList<QKeySequence>::end(in_stack_fffffffffffffeb0);
  while( true ) {
    local_40 = local_38.i;
    bVar1 = QList<QKeySequence>::const_iterator::operator!=(local_30,local_38);
    if (!bVar1) break;
    this_00 = QList<QKeySequence>::const_iterator::operator*(local_30);
    bVar1 = QKeySequence::isEmpty(this_00);
    if (bVar1) {
      QList<int>::append((QList<int> *)0x974dbc,in_stack_fffffffffffffeac);
    }
    else {
      this_01 = &in_RDI->shortcutIds;
      SVar5 = in_RDI->shortcutContext;
      in_stack_fffffffffffffee0 = in_RSI;
      in_stack_fffffffffffffee8 = pQVar2;
      (**(code **)(*(long *)in_RDI + 0x28))();
      QShortcutMap::addShortcut
                ((QShortcutMap *)this_01,(QObject *)CONCAT44(SVar5,in_stack_fffffffffffffef8),
                 this_00,(ShortcutContext)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                 (ContextMatcher)in_stack_fffffffffffffee0);
      QList<int>::append((QList<int> *)0x974da7,in_stack_fffffffffffffeac);
    }
    QList<QKeySequence>::const_iterator::operator++(local_30);
  }
  if ((*(ushort *)&in_RDI->field_0x188 & 1) == 0) {
    local_48.i = (int *)&DAT_aaaaaaaaaaaaaaaa;
    local_48 = QList<int>::begin((QList<int> *)in_stack_fffffffffffffeb0);
    local_50.i = (int *)&DAT_aaaaaaaaaaaaaaaa;
    local_50 = QList<int>::end((QList<int> *)in_stack_fffffffffffffeb0);
    while( true ) {
      local_58 = local_50.i;
      bVar1 = QList<int>::const_iterator::operator!=(&local_48,local_50);
      if (!bVar1) break;
      piVar3 = QList<int>::const_iterator::operator*(&local_48);
      iVar4 = *piVar3;
      if (iVar4 != 0) {
        in_stack_fffffffffffffec8 = in_RSI;
        in_stack_fffffffffffffed8 = pQVar2;
        QKeySequence::QKeySequence((QKeySequence *)0x974ed9);
        QShortcutMap::setShortcutEnabled
                  ((QShortcutMap *)in_stack_fffffffffffffee8,
                   SUB81((ulong)in_stack_fffffffffffffee0 >> 0x38,0),(int)in_stack_fffffffffffffee0,
                   in_stack_fffffffffffffed8,
                   (QKeySequence *)CONCAT44(iVar4,in_stack_fffffffffffffed0));
        QKeySequence::~QKeySequence((QKeySequence *)in_stack_fffffffffffffeb0);
        in_stack_fffffffffffffed4 = iVar4;
      }
      QList<int>::const_iterator::operator++(&local_48);
    }
  }
  if ((in_RDI->field_0x174 & 1) == 0) {
    local_68[0].i = (int *)&DAT_aaaaaaaaaaaaaaaa;
    local_68[0] = QList<int>::begin((QList<int> *)in_stack_fffffffffffffeb0);
    o = QList<int>::end((QList<int> *)in_stack_fffffffffffffeb0);
    while (bVar1 = QList<int>::const_iterator::operator!=(local_68,o), bVar1) {
      piVar3 = QList<int>::const_iterator::operator*(local_68);
      if (*piVar3 != 0) {
        pQVar2 = in_RSI;
        QKeySequence::QKeySequence((QKeySequence *)0x97501f);
        QShortcutMap::setShortcutAutoRepeat
                  ((QShortcutMap *)in_stack_fffffffffffffee0,
                   SUB81((ulong)in_stack_fffffffffffffed8 >> 0x38,0),(int)in_stack_fffffffffffffed8,
                   (QObject *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (QKeySequence *)in_stack_fffffffffffffec8);
        QKeySequence::~QKeySequence((QKeySequence *)pQVar2);
      }
      QList<int>::const_iterator::operator++(local_68);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QActionPrivate::redoGrab(QShortcutMap &map)
{
    Q_Q(QAction);
    for (int id : std::as_const(shortcutIds)) {
        if (id)
            map.removeShortcut(id, q);
    }

    shortcutIds.clear();
    for (const QKeySequence &shortcut : std::as_const(shortcuts)) {
        if (!shortcut.isEmpty())
            shortcutIds.append(map.addShortcut(q, shortcut, shortcutContext, contextMatcher()));
        else
            shortcutIds.append(0);
    }
    if (!enabled) {
        for (int id : std::as_const(shortcutIds)) {
            if (id)
                map.setShortcutEnabled(false, id, q);
        }
    }
    if (!autorepeat) {
        for (int id : std::as_const(shortcutIds)) {
            if (id)
                map.setShortcutAutoRepeat(false, id, q);
        }
    }
}